

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

TypeFunction *
GetFunctionTypeFromCache
          (DirectChainedMap<TypeFunction_*> *table,uint hash,TypeBase *returnType,
          ArrayView<ArgumentData> arguments)

{
  TypeFunction *pTVar1;
  TypeHandle *pTVar2;
  TypeBase *pTVar3;
  ArgumentData *pAVar4;
  uint i;
  uint index;
  IntrusiveList<TypeHandle> *pIVar5;
  NodeIterator it;
  ArrayView<ArgumentData> local_40;
  
  local_40.data = arguments.data;
  local_40.count = arguments.count;
  it = DirectChainedMap<TypeFunction_*>::first(table,hash);
  if (it.node != (Node *)0x0) {
    for (; it.node != (Node *)0x0; it = DirectChainedMap<TypeFunction_*>::next(table,it)) {
      pTVar1 = *(TypeFunction **)(it.node + 8);
      if (pTVar1->returnType == returnType) {
        index = 0;
        pIVar5 = &pTVar1->arguments;
        while ((pTVar2 = pIVar5->head, index < local_40.count && (pTVar2 != (TypeHandle *)0x0))) {
          pTVar3 = pTVar2->type;
          pAVar4 = ArrayView<ArgumentData>::operator[](&local_40,index);
          if (pTVar3 != pAVar4->type) goto LAB_001bf1b5;
          index = index + 1;
          pIVar5 = (IntrusiveList<TypeHandle> *)&pTVar2->next;
        }
        if ((local_40.count <= index) && (pTVar2 == (TypeHandle *)0x0)) {
          return pTVar1;
        }
      }
LAB_001bf1b5:
    }
  }
  return (TypeFunction *)0x0;
}

Assistant:

TypeFunction* GetFunctionTypeFromCache(DirectChainedMap<TypeFunction*> &table, unsigned hash, TypeBase* returnType, ArrayView<ArgumentData> arguments)
{
	typedef DirectChainedMap<TypeFunction*>::NodeIterator Node;

	if(Node curr = table.first(hash))
	{
		while(curr)
		{
			TypeFunction *type = curr.node->value;

			if(type->returnType != returnType)
			{
				curr = table.next(curr);
				continue;
			}

			TypeHandle *leftArg = type->arguments.head;

			bool match = true;

			for(unsigned i = 0; i < arguments.size(); i++)
			{
				if(!leftArg || leftArg->type != arguments[i].type)
				{
					match = false;
					break;
				}

				leftArg = leftArg->next;
			}

			if(!match || leftArg)
			{
				curr = table.next(curr);
				continue;
			}

			return type;
		}
	}

	return NULL;
}